

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRayDifferential> *
pbrt::CameraBase::GenerateRayDifferential
          (CameraHandle *camera,CameraSample *sample,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  CameraSample sample_00;
  CameraSample sample_01;
  CameraSample sample_02;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  CameraRay *pCVar14;
  undefined8 *in_RDX;
  optional<pbrt::CameraRayDifferential> *in_RDI;
  optional<pbrt::CameraRayDifferential> *poVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  Vector3<float> VVar18;
  Point3<float> PVar19;
  CameraSample sshift_1;
  Float eps_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  initializer_list<float> *__range1_1;
  optional<pbrt::CameraRay> ry;
  CameraSample sshift;
  Float eps;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<float> *__range1;
  optional<pbrt::CameraRay> rx;
  RayDifferential rd;
  optional<pbrt::CameraRay> cr;
  CameraRayDifferential *v;
  optional<pbrt::CameraRayDifferential> *this;
  optional<pbrt::CameraRay> *poVar20;
  optional<pbrt::CameraRay> *in_stack_fffffffffffff950;
  undefined8 *puVar21;
  undefined1 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff961;
  undefined1 in_stack_fffffffffffff962;
  undefined1 in_stack_fffffffffffff963;
  undefined4 in_stack_fffffffffffff964;
  CameraHandle *in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  undefined8 in_stack_fffffffffffff988;
  undefined8 in_stack_fffffffffffff990;
  undefined8 local_450 [2];
  undefined8 local_440;
  float local_438;
  undefined8 local_430;
  float local_428;
  undefined8 local_420;
  float local_418;
  undefined8 local_410;
  float local_408;
  undefined8 local_400;
  float local_3f8;
  undefined8 local_3f4;
  float local_3ec;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3c8;
  float local_3c0;
  undefined8 local_3b8;
  float local_3b0;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_398;
  float local_390;
  CameraRayDifferential *local_388;
  optional<pbrt::CameraRayDifferential> *poStack_380;
  optional<pbrt::CameraRay> *local_378;
  undefined8 local_328;
  optional<pbrt::CameraRayDifferential> *poStack_320;
  optional<pbrt::CameraRay> *local_318;
  float local_304;
  float *local_300;
  float *local_2f8;
  float local_2f0 [2];
  initializer_list<float> local_2e8;
  initializer_list<float> *local_2d8;
  optional<pbrt::CameraRay> local_2d0;
  undefined8 local_290;
  float local_288;
  undefined8 local_280;
  float local_278;
  undefined8 local_270;
  float local_268;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  float local_248;
  undefined8 local_244;
  float local_23c;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  CameraRayDifferential *local_1d8;
  optional<pbrt::CameraRayDifferential> *poStack_1d0;
  optional<pbrt::CameraRay> *local_1c8;
  undefined8 local_178;
  optional<pbrt::CameraRayDifferential> *poStack_170;
  optional<pbrt::CameraRay> *local_168;
  float local_15c;
  float *local_158;
  float *local_150;
  float local_148 [2];
  initializer_list<float> local_140;
  initializer_list<float> *local_130;
  optional<pbrt::CameraRay> local_128;
  undefined1 local_c0;
  undefined8 local_bc;
  float local_b4;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a4;
  float local_9c;
  undefined8 local_98;
  float local_90;
  undefined4 local_88;
  CameraRayDifferential *local_78;
  optional<pbrt::CameraRayDifferential> *poStack_70;
  undefined8 local_68;
  optional local_60 [72];
  undefined8 *local_18;
  
  local_68 = in_RDX[2];
  v = (CameraRayDifferential *)*in_RDX;
  this = (optional<pbrt::CameraRayDifferential> *)in_RDX[1];
  sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffff984;
  sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffff980;
  sample_00.pLens.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)in_stack_fffffffffffff988;
  sample_00._16_8_ = in_stack_fffffffffffff990;
  local_78 = v;
  poStack_70 = this;
  local_18 = in_RDX;
  CameraHandle::GenerateRay
            (in_stack_fffffffffffff968,sample_00,
             (SampledWavelengths *)
             CONCAT44(in_stack_fffffffffffff964,
                      CONCAT13(in_stack_fffffffffffff963,
                               CONCAT12(in_stack_fffffffffffff962,
                                        CONCAT11(in_stack_fffffffffffff961,in_stack_fffffffffffff960
                                                )))));
  bVar13 = pstd::optional::operator_cast_to_bool(local_60);
  if (bVar13) {
    pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x739a36);
    RayDifferential::RayDifferential((RayDifferential *)this,(Ray *)v);
    pstd::optional<pbrt::CameraRay>::optional(&local_128);
    local_148[0] = 0.05;
    local_148[1] = -0.05;
    local_140._M_array = local_148;
    local_140._M_len = 2;
    local_130 = &local_140;
    local_150 = std::initializer_list<float>::begin(local_130);
    local_158 = std::initializer_list<float>::end((initializer_list<float> *)this);
    for (; local_150 != local_158; local_150 = local_150 + 1) {
      local_15c = *local_150;
      poVar20 = (optional<pbrt::CameraRay> *)local_18[2];
      poVar15 = (optional<pbrt::CameraRayDifferential> *)local_18[1];
      local_178._0_4_ = (float)*local_18;
      local_178 = (CameraRayDifferential *)
                  CONCAT44((int)((ulong)*local_18 >> 0x20),(float)local_178 + local_15c);
      local_1d8 = local_178;
      sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffff984;
      sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffff980;
      sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffff988;
      sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff988 >> 0x20);
      sample_01.time = (Float)(int)in_stack_fffffffffffff990;
      sample_01.weight = (Float)(int)((ulong)in_stack_fffffffffffff990 >> 0x20);
      v = local_178;
      this = poVar15;
      poStack_1d0 = poVar15;
      local_1c8 = poVar20;
      poStack_170 = poVar15;
      local_168 = poVar20;
      CameraHandle::GenerateRay
                (in_stack_fffffffffffff968,sample_01,
                 (SampledWavelengths *)
                 CONCAT44(in_stack_fffffffffffff964,
                          CONCAT13(in_stack_fffffffffffff963,
                                   CONCAT12(in_stack_fffffffffffff962,
                                            CONCAT11(in_stack_fffffffffffff961,
                                                     in_stack_fffffffffffff960)))));
      pstd::optional<pbrt::CameraRay>::operator=(in_stack_fffffffffffff950,poVar20);
      pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x739bc8);
      bVar13 = pstd::optional::operator_cast_to_bool((optional *)&local_128);
      if (bVar13) {
        pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x739c0b);
        VVar18 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_fffffffffffff950,(Point3<float> *)poVar20);
        local_210 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar12._8_8_ = poVar15;
        auVar12._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_218 = vmovlpd_avx(auVar12);
        uVar16 = 0;
        local_208 = local_218;
        local_200 = local_210;
        VVar18 = Tuple3<pbrt::Vector3,float>::operator/
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff950,
                            (float)((ulong)poVar20 >> 0x20));
        local_220 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar17 = 0;
        auVar11._8_8_ = uVar16;
        auVar11._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_228 = vmovlpd_avx(auVar11);
        local_1f8 = local_228;
        local_1f0 = local_220;
        PVar19 = Point3<float>::operator+
                           ((Point3<float> *)in_stack_fffffffffffff950,(Vector3<float> *)poVar20);
        local_230 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
        uVar16 = 0;
        auVar10._8_8_ = uVar17;
        auVar10._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_238 = vmovlpd_avx(auVar10);
        local_1e8 = local_238;
        local_1e0 = local_230;
        local_bc = local_238;
        local_b4 = local_230;
        pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x739d92);
        VVar18 = Tuple3<pbrt::Vector3,float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff950,
                            (Vector3<float> *)poVar20);
        local_268 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar9._8_8_ = uVar16;
        auVar9._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_270 = vmovlpd_avx(auVar9);
        uVar16 = 0;
        local_260 = local_270;
        local_258 = local_268;
        VVar18 = Tuple3<pbrt::Vector3,float>::operator/
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff950,
                            (float)((ulong)poVar20 >> 0x20));
        local_278 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar17 = 0;
        auVar8._8_8_ = uVar16;
        auVar8._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_280 = vmovlpd_avx(auVar8);
        local_250 = local_280;
        local_248 = local_278;
        VVar18 = Tuple3<pbrt::Vector3,float>::operator+
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff950,
                            (Vector3<float> *)poVar20);
        local_288 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar7._8_8_ = uVar17;
        auVar7._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_290 = vmovlpd_avx(auVar7);
        local_244 = local_290;
        local_23c = local_288;
        local_a4 = local_290;
        local_9c = local_288;
        break;
      }
    }
    pstd::optional<pbrt::CameraRay>::optional(&local_2d0);
    local_2f0[0] = 0.05;
    local_2f0[1] = -0.05;
    local_2e8._M_array = local_2f0;
    local_2e8._M_len = 2;
    local_2d8 = &local_2e8;
    local_2f8 = std::initializer_list<float>::begin(local_2d8);
    local_300 = std::initializer_list<float>::end((initializer_list<float> *)this);
    for (; local_2f8 != local_300; local_2f8 = local_2f8 + 1) {
      local_304 = *local_2f8;
      poVar20 = (optional<pbrt::CameraRay> *)local_18[2];
      poVar15 = (optional<pbrt::CameraRayDifferential> *)local_18[1];
      local_328._4_4_ = (float)((ulong)*local_18 >> 0x20);
      local_328 = (CameraRayDifferential *)CONCAT44(local_328._4_4_ + local_304,(int)*local_18);
      local_388 = local_328;
      sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffff984;
      sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffff980;
      sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffff988;
      sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff988 >> 0x20);
      sample_02.time = (Float)(int)in_stack_fffffffffffff990;
      sample_02.weight = (Float)(int)((ulong)in_stack_fffffffffffff990 >> 0x20);
      v = local_328;
      this = poVar15;
      poStack_380 = poVar15;
      local_378 = poVar20;
      poStack_320 = poVar15;
      local_318 = poVar20;
      CameraHandle::GenerateRay
                (in_stack_fffffffffffff968,sample_02,
                 (SampledWavelengths *)
                 CONCAT44(in_stack_fffffffffffff964,
                          CONCAT13(in_stack_fffffffffffff963,
                                   CONCAT12(in_stack_fffffffffffff962,
                                            CONCAT11(in_stack_fffffffffffff961,
                                                     in_stack_fffffffffffff960)))));
      pstd::optional<pbrt::CameraRay>::operator=(in_stack_fffffffffffff950,poVar20);
      pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x73a0cd);
      bVar13 = pstd::optional::operator_cast_to_bool((optional *)&local_2d0);
      if (bVar13) {
        pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x73a110);
        VVar18 = Point3<float>::operator-
                           ((Point3<float> *)in_stack_fffffffffffff950,(Point3<float> *)poVar20);
        local_3c0 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar6._8_8_ = poVar15;
        auVar6._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_3c8 = vmovlpd_avx(auVar6);
        uVar16 = 0;
        local_3b8 = local_3c8;
        local_3b0 = local_3c0;
        VVar18 = Tuple3<pbrt::Vector3,float>::operator/
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff950,
                            (float)((ulong)poVar20 >> 0x20));
        local_3d0 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar17 = 0;
        auVar5._8_8_ = uVar16;
        auVar5._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_3d8 = vmovlpd_avx(auVar5);
        local_3a8 = local_3d8;
        local_3a0 = local_3d0;
        PVar19 = Point3<float>::operator+
                           ((Point3<float> *)in_stack_fffffffffffff950,(Vector3<float> *)poVar20);
        local_3e0 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
        uVar16 = 0;
        auVar4._8_8_ = uVar17;
        auVar4._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
        local_3e8 = vmovlpd_avx(auVar4);
        local_398 = local_3e8;
        local_390 = local_3e0;
        local_b0 = local_3e8;
        local_a8 = local_3e0;
        pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x73a297);
        VVar18 = Tuple3<pbrt::Vector3,float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff950,
                            (Vector3<float> *)poVar20);
        local_418 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar3._8_8_ = uVar16;
        auVar3._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_420 = vmovlpd_avx(auVar3);
        uVar16 = 0;
        local_410 = local_420;
        local_408 = local_418;
        VVar18 = Tuple3<pbrt::Vector3,float>::operator/
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff950,
                            (float)((ulong)poVar20 >> 0x20));
        local_428 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar17 = 0;
        auVar2._8_8_ = uVar16;
        auVar2._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_430 = vmovlpd_avx(auVar2);
        local_400 = local_430;
        local_3f8 = local_428;
        VVar18 = Tuple3<pbrt::Vector3,float>::operator+
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff950,
                            (Vector3<float> *)poVar20);
        local_438 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar1._8_8_ = uVar17;
        auVar1._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_440 = vmovlpd_avx(auVar1);
        local_3f4 = local_440;
        local_3ec = local_438;
        local_98 = local_440;
        local_90 = local_438;
        break;
      }
    }
    bVar13 = pstd::optional::operator_cast_to_bool((optional *)&local_128);
    local_c0 = false;
    if (bVar13) {
      local_c0 = pstd::optional::operator_cast_to_bool((optional *)&local_2d0);
    }
    RayDifferential::RayDifferential((RayDifferential *)this,&v->ray);
    puVar21 = local_450;
    pCVar14 = pstd::optional<pbrt::CameraRay>::operator->((optional<pbrt::CameraRay> *)0x73a4bc);
    uVar16 = *(undefined8 *)((pCVar14->weight).values.values + 2);
    *puVar21 = *(undefined8 *)(pCVar14->weight).values.values;
    puVar21[1] = uVar16;
    pstd::optional<pbrt::CameraRayDifferential>::optional(this,v);
    local_88 = 1;
    pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x73a505);
    pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x73a512);
  }
  else {
    memset(in_RDI,0,0x78);
    pstd::optional<pbrt::CameraRayDifferential>::optional(in_RDI);
    local_88 = 1;
  }
  pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)0x73a53d);
  return in_RDI;
}

Assistant:

pstd::optional<CameraRayDifferential> CameraBase::GenerateRayDifferential(
    CameraHandle camera, const CameraSample &sample, SampledWavelengths &lambda) {
    // Generate regular camera ray _cr_ for ray differential
    pstd::optional<CameraRay> cr = camera.GenerateRay(sample, lambda);
    if (!cr)
        return {};
    RayDifferential rd(cr->ray);

    // Find camera ray after shifting one pixel in the $x$ direction
    pstd::optional<CameraRay> rx;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.x += eps;
        // Try to generate ray with _sshift_ and compute $x$ differential
        if (rx = camera.GenerateRay(sshift, lambda); rx) {
            rd.rxOrigin = rd.o + (rx->ray.o - rd.o) / eps;
            rd.rxDirection = rd.d + (rx->ray.d - rd.d) / eps;
            break;
        }
    }

    // Find camera ray after shifting one pixel in the $y$ direction
    pstd::optional<CameraRay> ry;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.y += eps;
        if (ry = camera.GenerateRay(sshift, lambda); ry) {
            rd.ryOrigin = rd.o + (ry->ray.o - rd.o) / eps;
            rd.ryDirection = rd.d + (ry->ray.d - rd.d) / eps;
            break;
        }
    }

    // Return approximate ray differential and weight
    rd.hasDifferentials = rx && ry;
    return CameraRayDifferential{rd, cr->weight};
}